

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O0

void __thiscall FGLRenderer::PostProcessFXAA(FGLRenderer *this)

{
  int iVar1;
  undefined1 local_48 [8];
  FGLPostProcessState savedState;
  GLfloat resolution [2];
  FGLRenderer *this_local;
  
  iVar1 = FIntCVar::operator_cast_to_int(&gl_postprocess);
  if (iVar1 != 0) {
    iVar1 = FGLRenderBuffers::GetWidth(this->mBuffers);
    savedState.blendDestRgb = (GLint)(float)iVar1;
    iVar1 = FGLRenderBuffers::GetHeight(this->mBuffers);
    savedState.blendDestAlpha = (GLint)(float)iVar1;
    FGLPostProcessState::FGLPostProcessState((FGLPostProcessState *)local_48);
    FGLRenderBuffers::BindNextFB(this->mBuffers);
    FGLRenderBuffers::BindCurrentTexture(this->mBuffers,0);
    FFXAAShader::Bind(this->mFXAAShader);
    FBufferedUniform1i::Set(&this->mFXAAShader->InputTexture,0);
    FBufferedUniform2f::Set(&this->mFXAAShader->Resolution,(float *)&savedState.blendDestRgb);
    RenderScreenQuad(this);
    FGLRenderBuffers::NextTexture(this->mBuffers);
    FGLPostProcessState::~FGLPostProcessState((FGLPostProcessState *)local_48);
  }
  return;
}

Assistant:

void FGLRenderer::PostProcessFXAA()
{
	if (0 == gl_postprocess)
	{
		return;
	}

	const GLfloat resolution[2] =
	{
		static_cast<GLfloat>(mBuffers->GetWidth()),
		static_cast<GLfloat>(mBuffers->GetHeight())
	};

	FGLPostProcessState savedState;

	mBuffers->BindNextFB();
	mBuffers->BindCurrentTexture(0);
	mFXAAShader->Bind();
	mFXAAShader->InputTexture.Set(0);
	mFXAAShader->Resolution.Set(resolution);
	RenderScreenQuad();
	mBuffers->NextTexture();
}